

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlCharEncInFunc(xmlCharEncodingHandler *handler,xmlBufferPtr out,xmlBufferPtr in)

{
  int local_38;
  uint local_34;
  int local_30;
  int toconv;
  int written;
  int ret;
  xmlBufferPtr in_local;
  xmlBufferPtr out_local;
  xmlCharEncodingHandler *handler_local;
  
  if (handler == (xmlCharEncodingHandler *)0x0) {
    handler_local._4_4_ = -1;
  }
  else if (out == (xmlBufferPtr)0x0) {
    handler_local._4_4_ = -1;
  }
  else if (in == (xmlBufferPtr)0x0) {
    handler_local._4_4_ = -1;
  }
  else {
    local_34 = in->use;
    if (local_34 == 0) {
      handler_local._4_4_ = 0;
    }
    else {
      local_30 = (out->size - out->use) + -1;
      _written = in;
      in_local = out;
      out_local = (xmlBufferPtr)handler;
      if (local_30 <= (int)(local_34 * 2)) {
        xmlBufferGrow(out,out->size + local_34 * 2);
        local_30 = (in_local->size - in_local->use) + -1;
      }
      toconv = xmlEncInputChunk((xmlCharEncodingHandler *)out_local,
                                in_local->content + in_local->use,&local_30,_written->content,
                                (int *)&local_34);
      xmlBufferShrink(_written,local_34);
      in_local->use = local_30 + in_local->use;
      in_local->content[in_local->use] = '\0';
      if (local_30 == 0) {
        local_38 = toconv;
      }
      else {
        local_38 = local_30;
      }
      handler_local._4_4_ = local_38;
    }
  }
  return handler_local._4_4_;
}

Assistant:

int
xmlCharEncInFunc(xmlCharEncodingHandler * handler, xmlBufferPtr out,
                 xmlBufferPtr in)
{
    int ret;
    int written;
    int toconv;

    if (handler == NULL)
        return(XML_ENC_ERR_INTERNAL);
    if (out == NULL)
        return(XML_ENC_ERR_INTERNAL);
    if (in == NULL)
        return(XML_ENC_ERR_INTERNAL);

    toconv = in->use;
    if (toconv == 0)
        return (0);
    written = out->size - out->use -1; /* count '\0' */
    if (toconv * 2 >= written) {
        xmlBufferGrow(out, out->size + toconv * 2);
        written = out->size - out->use - 1;
    }
    ret = xmlEncInputChunk(handler, &out->content[out->use], &written,
                           in->content, &toconv);
    xmlBufferShrink(in, toconv);
    out->use += written;
    out->content[out->use] = 0;

    return (written? written : ret);
}